

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.hh
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
tchecker::parsing::system::parser_t::value_type::as<std::__cxx11::string>(value_type *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  value_type *this_local;
  
  if (this->yytypeid_ == (type_info *)0x0) {
    __assert_fail("yytypeid_",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.hh"
                  ,0x144,
                  "T &tchecker::parsing::system::parser_t::value_type::as() [T = std::basic_string<char>]"
                 );
  }
  bVar1 = std::type_info::operator==(this->yytypeid_,(type_info *)&std::__cxx11::string::typeinfo);
  if (!bVar1) {
    __assert_fail("*yytypeid_ == typeid (T)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O0/src/parsing/system_parser/system.tab.hh"
                  ,0x145,
                  "T &tchecker::parsing::system::parser_t::value_type::as() [T = std::basic_string<char>]"
                 );
  }
  pbVar2 = yyas_<std::__cxx11::string>(this);
  return pbVar2;
}

Assistant:

T&
    as () YY_NOEXCEPT
    {
      SPYY_ASSERT (yytypeid_);
      SPYY_ASSERT (*yytypeid_ == typeid (T));
      SPYY_ASSERT (sizeof (T) <= size);
      return *yyas_<T> ();
    }